

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O1

void __thiscall
kj::_::Debug::Fault::
Fault<kj::Exception::Type,char_const(&)[19],unsigned_long_long&,unsigned_long_long&>
          (Fault *this,char *file,int line,Type code,char *condition,char *macroArgs,
          char (*params) [19],unsigned_long_long *params_1,unsigned_long_long *params_2)

{
  long lVar1;
  undefined8 uVar2;
  undefined8 *puVar3;
  ArrayPtr<const_char> *params_00;
  CappedArray<char,_26UL> *params_01;
  CappedArray<char,_26UL> *params_02;
  long lVar4;
  CappedArray<char,_26UL> *this_00;
  CappedArray<char,_26UL> *__return_storage_ptr__;
  String argValues [3];
  String *pSVar5;
  undefined8 uVar6;
  String local_a8;
  String local_90;
  String local_78;
  CappedArray<char,_26UL> local_58;
  
  this->exception = (Exception *)0x0;
  local_58.content._0_8_ = strlen(*params);
  this_00 = &local_58;
  local_58.currentSize = (size_t)params;
  concat<kj::ArrayPtr<char_const>>(&local_a8,(_ *)this_00,params_00);
  __return_storage_ptr__ = &local_58;
  Stringifier::operator*(__return_storage_ptr__,(Stringifier *)this_00,*params_1);
  concat<kj::CappedArray<char,26ul>>(&local_90,(_ *)__return_storage_ptr__,params_01);
  Stringifier::operator*(&local_58,(Stringifier *)__return_storage_ptr__,*params_2);
  concat<kj::CappedArray<char,26ul>>(&local_78,(_ *)&local_58,params_02);
  pSVar5 = &local_a8;
  uVar6 = 3;
  init(this,(EVP_PKEY_CTX *)file);
  lVar4 = 0x30;
  do {
    lVar1 = *(long *)((long)&local_a8.content.ptr + lVar4);
    if (lVar1 != 0) {
      uVar2 = *(undefined8 *)((long)&local_a8.content.size_ + lVar4);
      *(undefined8 *)((long)&local_a8.content.ptr + lVar4) = 0;
      *(undefined8 *)((long)&local_a8.content.size_ + lVar4) = 0;
      puVar3 = *(undefined8 **)((long)&local_a8.content.disposer + lVar4);
      (**(code **)*puVar3)(puVar3,lVar1,1,uVar2,uVar2,0,pSVar5,uVar6);
    }
    lVar4 = lVar4 + -0x18;
  } while (lVar4 != -0x18);
  return;
}

Assistant:

Debug::Fault::Fault(const char* file, int line, Code code,
                    const char* condition, const char* macroArgs, Params&&... params)
    : exception(nullptr) {
  String argValues[sizeof...(Params)] = {str(params)...};
  init(file, line, code, condition, macroArgs,
       arrayPtr(argValues, sizeof...(Params)));
}